

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O3

PyObject * __thiscall
boost::python::detail::caller_arity<2U>::
impl<bool_(AbstractModuleClient::*)(StimulationCommand),_boost::python::default_call_policies,_boost::mpl::vector3<bool,_AbstractModuleClient_&,_StimulationCommand>_>
::operator()(impl<bool_(AbstractModuleClient::*)(StimulationCommand),_boost::python::default_call_policies,_boost::mpl::vector3<bool,_AbstractModuleClient_&,_StimulationCommand>_>
             *this,PyObject *args_,PyObject *param_2)

{
  _object *p_Var1;
  undefined1 uVar2;
  long lVar3;
  PyObject *pPVar4;
  long *plVar5;
  code *pcVar6;
  c_t1 c1;
  undefined1 local_d8 [16];
  undefined8 *local_c8 [10];
  _object *local_78;
  NetworkDataType local_68;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  lVar3 = converter::get_lvalue_from_python
                    ((_object *)args_[1].ob_type,
                     converter::detail::registered_base<AbstractModuleClient_const_volatile&>::
                     converters);
  if (lVar3 != 0) {
    p_Var1 = (_object *)args_[2].ob_refcnt;
    local_d8 = converter::rvalue_from_python_stage1
                         (p_Var1,converter::detail::
                                 registered_base<StimulationCommand_const_volatile&>::converters);
    if (local_d8._0_8_ != 0) {
      pcVar6 = (code *)(this->m_data).
                       super_compressed_pair_imp<bool_(AbstractModuleClient::*)(StimulationCommand),_boost::python::default_call_policies,_2>
                       .first_;
      plVar5 = (long *)(lVar3 + *(long *)&(this->m_data).
                                          super_compressed_pair_imp<bool_(AbstractModuleClient::*)(StimulationCommand),_boost::python::default_call_policies,_2>
                                          .field_0x8);
      if (((ulong)pcVar6 & 1) != 0) {
        pcVar6 = *(code **)(pcVar6 + *plVar5 + -1);
      }
      local_78 = p_Var1;
      if (local_d8._8_8_ != (code *)0x0) {
        (*local_d8._8_8_)(p_Var1,local_d8);
      }
      local_68._vptr_NetworkDataType = (_func_int **)&PTR__NetworkDataType_003ec178;
      local_60 = *(undefined4 *)(local_d8._0_8_ + 8);
      uStack_5c = *(undefined4 *)(local_d8._0_8_ + 0xc);
      uStack_58 = *(undefined4 *)(local_d8._0_8_ + 0x10);
      uStack_54 = *(undefined4 *)(local_d8._0_8_ + 0x14);
      local_50 = *(undefined4 *)(local_d8._0_8_ + 0x18);
      uStack_4c = *(undefined4 *)(local_d8._0_8_ + 0x1c);
      uStack_48 = *(undefined4 *)(local_d8._0_8_ + 0x20);
      uStack_44 = *(undefined4 *)(local_d8._0_8_ + 0x24);
      local_40 = *(undefined4 *)(local_d8._0_8_ + 0x28);
      uStack_3c = *(undefined4 *)(local_d8._0_8_ + 0x2c);
      uStack_38 = *(undefined4 *)(local_d8._0_8_ + 0x30);
      uStack_34 = *(undefined4 *)(local_d8._0_8_ + 0x34);
      local_30 = *(undefined4 *)(local_d8._0_8_ + 0x38);
      uStack_2c = *(undefined4 *)(local_d8._0_8_ + 0x3c);
      uStack_28 = *(undefined4 *)(local_d8._0_8_ + 0x40);
      uStack_24 = *(undefined4 *)(local_d8._0_8_ + 0x44);
      uVar2 = (*pcVar6)(plVar5);
      pPVar4 = (PyObject *)PyBool_FromLong(uVar2);
      NetworkDataType::~NetworkDataType(&local_68);
      if ((undefined8 **)local_d8._0_8_ != local_c8) {
        return pPVar4;
      }
      (*(code *)*local_c8[0])();
      return pPVar4;
    }
  }
  return (PyObject *)0x0;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }